

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_ReserveLessThanExisting_Test::
RepeatedPtrFieldTest_ReserveLessThanExisting_Test
          (RepeatedPtrFieldTest_ReserveLessThanExisting_Test *this)

{
  RepeatedPtrFieldTest_ReserveLessThanExisting_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldTest_ReserveLessThanExisting_Test_029e9f28;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, ReserveLessThanExisting) {
  RepeatedPtrField<std::string> field;
  field.Reserve(20);
  const std::string* const* previous_ptr = field.data();
  field.Reserve(10);

  EXPECT_EQ(previous_ptr, field.data());
  EXPECT_LE(20, ReservedSpace(&field));
}